

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

void __thiscall
slang::analysis::DataFlowAnalysis::noteReference
          (DataFlowAnalysis *this,ValueSymbol *symbol,Expression *lsp)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  SmallVector<slang::ast::EvalContext::Frame,_2UL> *pSVar4;
  size_type sVar5;
  raw_key_type *__y;
  type_conflict *ptVar6;
  pointer ppVar7;
  ulong uVar8;
  pair<unsigned_long,_unsigned_long> *ppVar9;
  raw_key_type *__y_00;
  pointer ppVar10;
  undefined8 in_RDX;
  undefined8 in_RSI;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar11;
  pair<unsigned_long,_unsigned_long> itBounds;
  overlap_iterator lspIt;
  SymbolLSPMap *lspMap;
  uint index;
  type_conflict *inserted;
  type *it;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  DataFlowState *currState;
  locator loc;
  size_t pos0;
  size_t hash;
  ValueSymbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  ValueSymbol **k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  overlap_iterator *in_stack_fffffffffffffa88;
  ValueSymbol *in_stack_fffffffffffffa90;
  SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *in_stack_fffffffffffffa98;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *in_stack_fffffffffffffaa0;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *in_stack_fffffffffffffaa8;
  const_iterator *in_stack_fffffffffffffab0;
  char *hash_00;
  size_t in_stack_fffffffffffffab8;
  char *pos0_00;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
  *in_stack_fffffffffffffac0;
  uint *in_stack_fffffffffffffad0;
  undefined6 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffafe;
  undefined1 in_stack_fffffffffffffaff;
  try_emplace_args_t *in_stack_fffffffffffffb00;
  ValueSymbol **in_stack_fffffffffffffb08;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
  *in_stack_fffffffffffffb10;
  equal_to<const_slang::ast::ValueSymbol_*> *in_stack_fffffffffffffb18;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  *in_stack_fffffffffffffb20;
  undefined8 local_4a0 [18];
  Type *in_stack_fffffffffffffbf0;
  EvalContext *in_stack_fffffffffffffbf8;
  Expression *in_stack_fffffffffffffc00;
  int local_3e0;
  undefined1 local_31c [60];
  DataFlowState *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  overlap_iterator *local_2c0;
  undefined1 *local_2b8;
  SmallVector<slang::ast::EvalContext::Frame,_2UL> *local_2b0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_2a8;
  undefined8 *local_290;
  char *local_288;
  undefined1 local_279;
  overlap_iterator *local_278;
  undefined1 *local_270;
  SmallVector<slang::ast::EvalContext::Frame,_2UL> *local_268;
  bool local_259 [25];
  iterator local_240;
  bool local_229 [25];
  iterator local_210;
  bool local_1f9;
  iterator local_1f8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
  local_1e8;
  size_t local_1d0;
  size_t local_1c8;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  *local_1c0;
  overlap_iterator *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  SmallVector<slang::ast::EvalContext::Frame,_2UL> *local_1a0;
  uint local_194;
  value_type *local_190;
  value_type *local_188;
  uint local_17c;
  group_type *local_178;
  size_t local_170;
  pow2_quadratic_prober local_168;
  size_t local_158;
  size_t local_150;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
  *local_148;
  SmallVector<slang::ast::EvalContext::Frame,_2UL> *local_140;
  undefined1 local_131;
  undefined8 *local_130;
  char *local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *local_80;
  undefined8 *local_78;
  undefined1 *local_70;
  char *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *local_10;
  char *local_8;
  
  local_2d8 = in_RDX;
  local_2d0 = in_RSI;
  local_2e0 = AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              ::getState(in_RDI);
  if ((local_2e0->reachable & 1U) != 0) {
    FlowAnalysisBase::getEvalContext(&in_RDI->super_FlowAnalysisBase);
    ast::ValueSymbol::getType((ValueSymbol *)0xb035b4);
    ast::ValueDriver::getBounds
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb035e1);
    if (bVar2) {
      if ((in_RDI[1].super_FlowAnalysisBase.evalContext.warnings.
           super_SmallVector<slang::Diagnostic,_2UL>.stackBase[0x60] & 1U) == 0) {
        hash_00 = in_RDI[1].super_FlowAnalysisBase.evalContext.warnings.
                  super_SmallVector<slang::Diagnostic,_2UL>.stackBase + 0x18;
        local_4a0[0] = local_2d0;
        local_290 = local_4a0;
        local_70 = &local_131;
        local_288 = hash_00;
        local_130 = local_290;
        local_128 = hash_00;
        local_78 = local_290;
        local_68 = hash_00;
        local_80 = (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                   ::key_from<slang::ast::ValueSymbol_const*>(local_290);
        local_88 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                   ::hash_for<slang::ast::ValueSymbol_const*>
                             ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                               *)in_stack_fffffffffffffa90,(ValueSymbol **)in_stack_fffffffffffffa88
                             );
        local_90 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                   ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                                   *)in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88);
        local_10 = local_80;
        local_20 = local_88;
        pos0_00 = hash_00;
        local_18 = local_90;
        local_8 = hash_00;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_30,local_90);
        do {
          local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
          local_40 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                     ::groups((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                               *)0xb040d4);
          local_40 = local_40 + local_38;
          local_44 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
          if (local_44 != 0) {
            local_50 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                       ::elements((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                                   *)0xb04123);
            local_58 = local_50 + local_38 * 0xf;
            do {
              local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffaa0 =
                   (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                           *)0xb04173);
              in_stack_fffffffffffffaa8 = local_10;
              __y_00 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                       ::
                       key_from<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>>
                                 ((pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                                   *)0xb041a0);
              bVar2 = std::equal_to<const_slang::ast::ValueSymbol_*>::operator()
                                ((equal_to<const_slang::ast::ValueSymbol_*> *)
                                 in_stack_fffffffffffffaa0,(ValueSymbol **)in_stack_fffffffffffffaa8
                                 ,__y_00);
              if (bVar2) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
                ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
                goto LAB_00b04294;
              }
              local_44 = local_44 - 1 & local_44;
            } while (local_44 != 0);
          }
          bVar2 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88);
          if (bVar2) {
            memset(&local_a8,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
            ::table_locator(&local_a8);
            goto LAB_00b04294;
          }
          bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_30,*(size_t *)(pos0_00 + 0x10));
        } while (bVar2);
        memset(&local_a8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
        ::table_locator(&local_a8);
LAB_00b04294:
        bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_a8);
        if (bVar2) {
          local_b8 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                     ::make_iterator((locator *)0xb042b4);
          local_b9 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_2a8,&local_b8,&local_b9);
        }
        else if (*(ulong *)(hash_00 + 0x30) < *(ulong *)(hash_00 + 0x28)) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
                    (in_stack_fffffffffffffac0,(size_t)pos0_00,(size_t)hash_00,
                     (try_emplace_args_t *)in_stack_fffffffffffffaa8,
                     (ValueSymbol **)in_stack_fffffffffffffaa0);
          local_d0 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                     ::make_iterator((locator *)0xb0433c);
          local_e9[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_2a8,&local_d0,local_e9);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
                    (in_stack_fffffffffffffb10,(size_t)in_stack_fffffffffffffb08,
                     in_stack_fffffffffffffb00,
                     (ValueSymbol **)
                     CONCAT17(in_stack_fffffffffffffaff,
                              CONCAT16(in_stack_fffffffffffffafe,in_stack_fffffffffffffaf8)));
          local_100 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                      ::make_iterator((locator *)0xb043aa);
          local_119[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    (&local_2a8,&local_100,local_119);
        }
        ppVar10 = boost::unordered::detail::foa::
                  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                  ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                                *)0xb043ec);
        ppVar9 = (pair<unsigned_long,_unsigned_long> *)&ppVar10->second;
        std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
                  ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb04402);
        IntervalMap<unsigned_long,_std::monostate,_3U>::unionWith
                  ((IntervalMap<unsigned_long,_std::monostate,_3U> *)in_stack_fffffffffffffaa0,
                   ppVar9,(monostate *)in_stack_fffffffffffffa90,
                   (allocator_type *)in_stack_fffffffffffffa88);
      }
      else {
        pSVar4 = &in_RDI[1].super_FlowAnalysisBase.evalContext.stack;
        local_31c._4_8_ = local_2d0;
        sVar5 = SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::size
                          ((SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *)
                           (in_RDI[1].super_FlowAnalysisBase.evalContext.stack.
                            super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement +
                           0x20));
        local_31c._0_4_ = (undefined4)sVar5;
        local_2b8 = local_31c + 4;
        local_2c0 = (overlap_iterator *)local_31c;
        local_1a8 = &local_279;
        local_2b0 = pSVar4;
        local_278 = local_2c0;
        local_270 = local_2b8;
        local_268 = pSVar4;
        local_1b8 = local_2c0;
        local_1b0 = local_2b8;
        local_1a0 = pSVar4;
        local_1c0 = (table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                     *)boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                       ::key_from<slang::ast::ValueSymbol_const*,unsigned_int>(local_2b8,local_2c0);
        local_1c8 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                    ::hash_for<slang::ast::ValueSymbol_const*>
                              ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                                *)in_stack_fffffffffffffa90,
                               (ValueSymbol **)in_stack_fffffffffffffa88);
        local_1d0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                    ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                                    *)in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88);
        local_148 = local_1c0;
        local_158 = local_1c8;
        local_150 = local_1d0;
        local_140 = pSVar4;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_168,local_1d0);
        do {
          local_170 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_168);
          local_178 = boost::unordered::detail::foa::
                      table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                      ::groups((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                                *)0xb037d4);
          local_178 = local_178 + local_170;
          local_17c = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::match
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_fffffffffffffa98,(size_t)in_stack_fffffffffffffa90);
          if (local_17c != 0) {
            local_188 = boost::unordered::detail::foa::
                        table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                        ::elements((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                                    *)0xb03826);
            local_190 = local_188 + local_170 * 0xf;
            do {
              local_194 = boost::unordered::detail::foa::unchecked_countr_zero(0);
              in_stack_fffffffffffffb18 =
                   boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                           *)0xb03879);
              in_stack_fffffffffffffb20 = local_148;
              __y = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                    ::key_from<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>>
                              ((pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)0xb038ac)
              ;
              bVar2 = std::equal_to<const_slang::ast::ValueSymbol_*>::operator()
                                (in_stack_fffffffffffffb18,(ValueSymbol **)in_stack_fffffffffffffb20
                                 ,__y);
              if (bVar2) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
                ::table_locator(&local_1e8,local_178,local_194,local_190 + local_194);
                goto LAB_00b039a9;
              }
              local_17c = local_17c - 1 & local_17c;
            } while (local_17c != 0);
          }
          bVar2 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffa90,(size_t)in_stack_fffffffffffffa88);
          if (bVar2) {
            memset(&local_1e8,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
            ::table_locator(&local_1e8);
            goto LAB_00b039a9;
          }
          bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_168,
                             in_RDI[1].super_FlowAnalysisBase.evalContext.stack.
                             super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap);
        } while (bVar2);
        memset(&local_1e8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
        ::table_locator(&local_1e8);
LAB_00b039a9:
        bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                          ((table_locator *)&local_1e8);
        if (bVar2) {
          local_1f8 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                      ::make_iterator((locator *)0xb039c9);
          local_1f9 = false;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                      *)(local_31c + 0xc),&local_1f8,&local_1f9);
        }
        else if (*(ulong *)(in_RDI[1].super_FlowAnalysisBase.evalContext.stack.
                            super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement +
                           0x18) <
                 *(ulong *)(in_RDI[1].super_FlowAnalysisBase.evalContext.stack.
                            super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement +
                           0x10)) {
          in_stack_fffffffffffffa88 = local_1b8;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*,unsigned_int>
                    ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                      *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                     (size_t)in_stack_fffffffffffffab0,
                     (try_emplace_args_t *)in_stack_fffffffffffffaa8,
                     (ValueSymbol **)in_stack_fffffffffffffaa0,in_stack_fffffffffffffad0);
          local_210 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                      ::make_iterator((locator *)0xb03a67);
          local_229[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                      *)(local_31c + 0xc),&local_210,local_229);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*,unsigned_int>
                    (in_stack_fffffffffffffb20,(size_t)in_stack_fffffffffffffb18,
                     (try_emplace_args_t *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                     (uint *)in_stack_fffffffffffffb00);
          local_240 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                      ::make_iterator((locator *)0xb03ae0);
          local_259[0] = true;
          std::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
          ::
          pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                    ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                      *)(local_31c + 0xc),&local_240,local_259);
        }
        std::
        get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                  ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                    *)0xb03b22);
        ptVar6 = std::
                 get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                           ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                             *)0xb03b37);
        if ((*ptVar6 & 1U) != 0) {
          SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::
          emplace_back<slang::ast::ValueSymbol_const&>
                    (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
        }
        ppVar7 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                               *)0xb03b79);
        uVar1 = ppVar7->second;
        uVar8 = (ulong)uVar1;
        sVar5 = SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::size
                          ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                            *)local_2e0);
        if (sVar5 <= uVar8) {
          SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::resize
                    ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                     in_stack_fffffffffffffa90,(size_type)in_stack_fffffffffffffa88);
        }
        SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator[]
                  ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
                   local_2e0,(ulong)uVar1);
        std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
                  ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb03bf2);
        IntervalMap<unsigned_long,_std::monostate,_3U>::unionWith
                  ((IntervalMap<unsigned_long,_std::monostate,_3U> *)in_stack_fffffffffffffaa0,
                   (pair<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffa98,
                   (monostate *)in_stack_fffffffffffffa90,
                   (allocator_type *)in_stack_fffffffffffffa88);
        SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::operator[]
                  ((SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *)
                   (in_RDI[1].super_FlowAnalysisBase.evalContext.stack.
                    super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement + 0x20),
                   (ulong)uVar1);
        std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
                  ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb03c5c);
        IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                  ((IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)
                   in_stack_fffffffffffffa98,
                   (pair<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffa90);
        while( true ) {
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                    (in_stack_fffffffffffffaa8);
          bVar2 = IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
                  operator==((overlap_iterator *)in_stack_fffffffffffffa90,
                             (const_iterator *)in_stack_fffffffffffffa88);
          bVar3 = bVar2 ^ 0xff;
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::iterator::~iterator
                    ((iterator *)0xb03cbd);
          if ((bVar3 & 1) == 0) break;
          pVar11 = IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::
                   bounds(in_stack_fffffffffffffab0);
          ppVar9 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator->
                             ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb03d61);
          if ((pVar11.first <= ppVar9->first) &&
             (ppVar9 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator->
                                 ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb03d88),
             ppVar9->second <= pVar11.second)) {
            local_3e0 = 1;
            goto LAB_00b03eea;
          }
          ppVar9 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator->
                             ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb03db3);
          if ((ppVar9->first < pVar11.first) &&
             (ppVar9 = std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator->
                                 ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb03dd1),
             pVar11.second < ppVar9->second)) {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
            overlap_iterator((overlap_iterator *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88
                            );
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::erase
                      (in_stack_fffffffffffffaa0,(overlap_iterator *)in_stack_fffffffffffffa98,
                       (allocator_type *)in_stack_fffffffffffffa90);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
            ~overlap_iterator((overlap_iterator *)0xb03e37);
            std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
                      ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb03e51);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                      ((IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)
                       in_stack_fffffffffffffa98,
                       (pair<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffa90);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
            operator=((overlap_iterator *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
            ~overlap_iterator((overlap_iterator *)0xb03e8c);
          }
          else {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
            operator++((overlap_iterator *)in_stack_fffffffffffffaa0);
          }
        }
        local_3e0 = 4;
LAB_00b03eea:
        IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
        ~overlap_iterator((overlap_iterator *)0xb03ef7);
        if (local_3e0 != 1) {
          std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
                    ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0xb03f37);
          local_4a0[1] = local_2d8;
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::insert
                    (in_stack_fffffffffffffaa0,
                     (pair<unsigned_long,_unsigned_long> *)in_stack_fffffffffffffa98,
                     (Expression **)in_stack_fffffffffffffa90,
                     (allocator_type *)in_stack_fffffffffffffa88);
        }
      }
    }
  }
  return;
}

Assistant:

void DataFlowAnalysis::noteReference(const ValueSymbol& symbol, const Expression& lsp) {
    // This feels icky but we don't count a symbol as being referenced in the procedure
    // if it's only used inside an unreachable flow path. The alternative would just
    // frustrate users, but the reason it's icky is because whether a path is reachable
    // is based on whatever level of heuristics we're willing to implement rather than
    // some well defined set of rules in the LRM.
    auto& currState = getState();
    if (!currState.reachable)
        return;

    auto bounds = ValueDriver::getBounds(lsp, getEvalContext(), symbol.getType());
    if (!bounds) {
        // This probably cannot be hit given that we early out elsewhere for
        // invalid expressions.
        return;
    }

    if (isLValue) {
        auto [it, inserted] = symbolToSlot.try_emplace(&symbol, (uint32_t)lvalues.size());
        if (inserted) {
            lvalues.emplace_back(symbol);
            SLANG_ASSERT(lvalues.size() == symbolToSlot.size());
        }

        auto index = it->second;
        if (index >= currState.assigned.size())
            currState.assigned.resize(index + 1);

        currState.assigned[index].unionWith(*bounds, {}, bitMapAllocator);

        auto& lspMap = lvalues[index].assigned;
        for (auto lspIt = lspMap.find(*bounds); lspIt != lspMap.end();) {
            // If we find an existing entry that completely contains
            // the new bounds we can just keep that one and ignore the
            // new one. Otherwise we will insert a new entry.
            auto itBounds = lspIt.bounds();
            if (itBounds.first <= bounds->first && itBounds.second >= bounds->second)
                return;

            // If the new bounds completely contain the existing entry, we can remove it.
            if (bounds->first < itBounds.first && bounds->second > itBounds.second) {
                lspMap.erase(lspIt, lspMapAllocator);
                lspIt = lspMap.find(*bounds);
            }
            else {
                ++lspIt;
            }
        }
        lspMap.insert(*bounds, &lsp, lspMapAllocator);
    }
    else {
        rvalues[&symbol].unionWith(*bounds, {}, bitMapAllocator);
    }
}